

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

StringResult<QString> * __thiscall
QCborStreamReader::_readString_helper
          (StringResult<QString> *__return_storage_ptr__,QCborStreamReader *this)

{
  QCborStreamReader QVar1;
  byte bVar2;
  uint uVar3;
  QArrayData *data;
  long *plVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  StringResultCode SVar8;
  ulong uVar9;
  StringResult<long_long> SVar10;
  ReadStringChunk params;
  
  *(undefined1 **)&__return_storage_ptr__->status = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.d = (Data *)0x0;
  (__return_storage_ptr__->data).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->data).d.size = 0;
  __return_storage_ptr__->status = Error;
  params.maxlen_or_type = -3;
  params.field_0.array = (QByteArray *)__return_storage_ptr__;
  SVar10 = QCborStreamReaderPrivate::readStringChunk
                     (*(QCborStreamReaderPrivate **)(this + 8),params);
  SVar8 = SVar10.status;
  __return_storage_ptr__->status = SVar8;
  if (SVar8 == EndOfString) {
    plVar4 = *(long **)(this + 8);
    if ((int)plVar4[0xc] == 0) {
      QVar1 = *(QCborStreamReader *)((long)plVar4 + 0x5e);
      this[0x10] = QVar1;
      if (QVar1 == (QCborStreamReader)0xff) {
        if ((*plVar4 != 0) && (plVar4[6] == 0)) {
          QByteArray::clear((QByteArray *)(plVar4 + 1));
          puVar7 = *(undefined8 **)(this + 8);
          if (puVar7[0xd] != 0) {
            QIODevice::skip((QIODevice *)*puVar7,puVar7[0xd]);
            puVar7 = *(undefined8 **)(this + 8);
          }
          puVar7[0xd] = 0;
        }
      }
      else {
        *(undefined4 *)(plVar4 + 0xc) = 0;
        if ((byte)((char)QVar1 + 0xbU) < 3) {
          this[0x10] = (QCborStreamReader)0xe0;
          *(ulong *)this = (ulong)*(byte *)(plVar4[2] + plVar4[0xd]) - 0xe0;
        }
        else {
          bVar2 = *(byte *)((long)plVar4 + 0x5f);
          if ((bVar2 & 2) == 0) {
            uVar9 = (ulong)*(ushort *)((long)plVar4 + 0x5c);
          }
          else {
            lVar5 = *(long *)(plVar4[10] + 0x10);
            lVar6 = *(long *)(plVar4[10] + 0x68);
            if ((bVar2 & 1) == 0) {
              uVar3 = *(uint *)(lVar5 + 1 + lVar6);
              uVar9 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                             uVar3 << 0x18);
            }
            else {
              uVar9 = *(ulong *)(lVar5 + 1 + lVar6);
              uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
            }
          }
          *(ulong *)this = uVar9;
          if ((bVar2 & 4) != 0 && QVar1 == (QCborStreamReader)0x0) {
            this[0x10] = (QCborStreamReader)0x20;
          }
        }
      }
    }
  }
  else if ((SVar8 == Error) && ((__return_storage_ptr__->data).d.ptr != (char16_t *)0x0)) {
    data = &((__return_storage_ptr__->data).d.d)->super_QArrayData;
    (__return_storage_ptr__->data).d.d = (Data *)0x0;
    (__return_storage_ptr__->data).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->data).d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QCborStreamReader::StringResult<QString> QCborStreamReader::_readString_helper()
{
    QCborStreamReader::StringResult<QString> result;
    auto r = d->readStringChunk(&result.data);
    result.status = r.status;
    if (r.status == Error) {
        result.data.clear();
    } else {
        Q_ASSERT(r.data == result.data.size());
        if (r.status == EndOfString && lastError() == QCborError::NoError)
            preparse();
    }

    return result;
}